

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Params *pPVar3;
  long lVar4;
  long *plVar5;
  Printer *pPVar6;
  LogMessage *other;
  const_iterator cVar7;
  mapped_type *pmVar8;
  Descriptor *pDVar9;
  FieldGenerator *pFVar10;
  string *value;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar11;
  OneofDescriptor *extraout_RDX;
  OneofDescriptor *extraout_RDX_00;
  OneofDescriptor *pOVar12;
  OneofDescriptor *extraout_RDX_01;
  OneofDescriptor *extraout_RDX_02;
  OneofDescriptor *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar13;
  size_type sVar14;
  undefined8 extraout_RDX_07;
  OneofDescriptor *extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  long lVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  javanano *this_00;
  long lVar20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_c0;
  Printer *local_a0;
  key_type local_98;
  undefined1 local_78 [12];
  uint uStack_6c;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_38;
  
  if ((this->params_->store_unknown_fields_ == false) &&
     ((*(int *)(this->descriptor_ + 0x78) != 0 || (*(int *)(this->descriptor_ + 0x68) != 0)))) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_message.cc"
               ,0x71);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_78,
                       "Extensions are only supported in NANO_RUNTIME if the \'store_unknown_fields\' generator option is \'true\'\n"
                      );
    internal::LogFinisher::operator=((LogFinisher *)&local_c0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
  }
  pPVar3 = this->params_;
  if ((pPVar3->override_java_multiple_files_ == JAVANANO_MUL_FALSE) ||
     (((pPVar3->override_java_multiple_files_ != JAVANANO_MUL_TRUE &&
       (cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(pPVar3->java_multiple_files_)._M_t,
                       (key_type *)**(undefined8 **)(this->descriptor_ + 0x10)),
       (_Rb_tree_header *)cVar7._M_node ==
       &(pPVar3->java_multiple_files_)._M_t._M_impl.super__Rb_tree_header)) ||
      (pDVar9 = this->descriptor_, *(long *)(pDVar9 + 0x18) != 0)))) {
    pDVar9 = this->descriptor_;
    pcVar18 = "\npublic static final class $classname$ extends\n";
  }
  else {
    pcVar18 = "\n@SuppressWarnings(\"hiding\")\npublic final class $classname$ extends\n";
  }
  io::Printer::Print(printer,pcVar18,"classname",*(string **)pDVar9);
  pPVar3 = this->params_;
  if (pPVar3->store_unknown_fields_ == true) {
    if (pPVar3->parcelable_messages_ == true) {
      value = *(string **)this->descriptor_;
      pcVar18 = "    com.google.protobuf.nano.android.ParcelableExtendableMessageNano<$classname$>";
    }
    else {
      value = *(string **)this->descriptor_;
      pcVar18 = "    com.google.protobuf.nano.ExtendableMessageNano<$classname$>";
    }
    io::Printer::Print(printer,pcVar18,"classname",value);
  }
  else {
    if (pPVar3->parcelable_messages_ == true) {
      pcVar18 = "    com.google.protobuf.nano.android.ParcelableMessageNano";
    }
    else {
      pcVar18 = "    com.google.protobuf.nano.MessageNano";
    }
    io::Printer::Print(printer,pcVar18);
  }
  pcVar18 = " {\n";
  if (this->params_->generate_clone_ != false) {
    pcVar18 = " implements java.lang.Cloneable {\n";
  }
  io::Printer::Print(printer,pcVar18);
  io::Printer::Indent(printer);
  if (this->params_->parcelable_messages_ == true) {
    io::Printer::Print(printer,
                       "\n// Used by Parcelable\n@SuppressWarnings({\"unused\"})\npublic static final android.os.Parcelable.Creator<$classname$> CREATOR =\n    new com.google.protobuf.nano.android.ParcelableMessageNanoCreator<\n        $classname$>($classname$.class);\n"
                       ,"classname",*(string **)this->descriptor_);
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x78)) {
    lVar15 = 0;
    lVar20 = 0;
    do {
      ExtensionGenerator::ExtensionGenerator
                ((ExtensionGenerator *)local_78,
                 (FieldDescriptor *)(*(long *)(pDVar9 + 0x80) + lVar15),this->params_);
      ExtensionGenerator::Generate((ExtensionGenerator *)local_78,printer);
      ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)local_78);
      lVar20 = lVar20 + 1;
      pDVar9 = this->descriptor_;
      lVar15 = lVar15 + 0xa8;
    } while (lVar20 < *(int *)(pDVar9 + 0x78));
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x58)) {
    lVar15 = 0;
    lVar20 = 0;
    do {
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)local_78,(EnumDescriptor *)(*(long *)(pDVar9 + 0x60) + lVar15),
                 this->params_);
      EnumGenerator::Generate((EnumGenerator *)local_78,printer);
      EnumGenerator::~EnumGenerator((EnumGenerator *)local_78);
      lVar20 = lVar20 + 1;
      pDVar9 = this->descriptor_;
      lVar15 = lVar15 + 0x38;
    } while (lVar20 < *(int *)(pDVar9 + 0x58));
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x48)) {
    lVar15 = 0;
    lVar20 = 0;
    do {
      lVar4 = *(long *)(pDVar9 + 0x50);
      if ((*(char *)(*(long *)(lVar4 + 0x20 + lVar15) + 0x6b) != '\x01') ||
         (*(int *)(*(long *)(lVar4 + 0x10 + lVar15) + 0x8c) != 3)) {
        register0x00000030 = (Descriptor *)(lVar4 + lVar15);
        local_78._0_8_ = this->params_;
        FieldGeneratorMap::FieldGeneratorMap
                  ((FieldGeneratorMap *)local_68,register0x00000030,(Params *)local_78._0_8_);
        Generate((MessageGenerator *)local_78,printer);
        FieldGeneratorMap::~FieldGeneratorMap((FieldGeneratorMap *)local_68);
      }
      lVar20 = lVar20 + 1;
      pDVar9 = this->descriptor_;
      lVar15 = lVar15 + 0xa8;
    } while (lVar20 < *(int *)(pDVar9 + 0x48));
  }
  local_68._8_8_ = local_78 + 8;
  stack0xffffffffffffff90 = (Descriptor *)((ulong)uStack_6c << 0x20);
  local_68._0_8_ = (_Base_ptr)0x0;
  local_50._M_allocated_capacity = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_68._16_8_ = local_68._8_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"message_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,&local_c0);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  pOVar12 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    pOVar12 = extraout_RDX_00;
  }
  pDVar9 = this->descriptor_;
  local_a0 = printer;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    paVar1 = &local_98.field_2;
    lVar15 = 0;
    do {
      this_00 = (javanano *)(lVar15 * 0x30 + *(long *)(pDVar9 + 0x40));
      UnderscoresToCamelCase_abi_cxx11_(&local_c0,this_00,pOVar12);
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"oneof_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_78,&local_98);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_c0);
      pOVar12 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        pOVar12 = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        pOVar12 = extraout_RDX_03;
      }
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_c0,this_00,pOVar12);
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"oneof_capitalized_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_78,&local_98);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_c0);
      iVar11 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        iVar11 = extraout_EDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        iVar11 = extraout_EDX_01;
      }
      SimpleItoa_abi_cxx11_
                (&local_c0,
                 (protobuf *)
                 (ulong)(uint)((int)((ulong)((long)this_00 -
                                            *(long *)(*(long *)(this_00 + 0x10) + 0x40)) >> 4) *
                              -0x55555555),iVar11);
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"oneof_index","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_78,&local_98);
      local_38 = lVar15;
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_c0);
      uVar13 = extraout_RDX_04;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        uVar13 = extraout_RDX_05;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        uVar13 = extraout_RDX_06;
      }
      if (0 < *(int *)(this_00 + 0x1c)) {
        lVar15 = 0;
        do {
          plVar5 = *(long **)(*(long *)(this_00 + 0x20) + lVar15 * 8);
          SimpleItoa_abi_cxx11_(&local_c0,(protobuf *)(ulong)*(uint *)(plVar5 + 7),(int)uVar13);
          local_98._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"number","");
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_78,&local_98);
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          plVar5 = (long *)*plVar5;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          lVar20 = *plVar5;
          std::__cxx11::string::_M_construct<char*>((string *)&local_c0,lVar20,plVar5[1] + lVar20);
          if (local_c0._M_string_length != 0) {
            sVar14 = 0;
            do {
              if ((byte)(local_c0._M_dataplus._M_p[sVar14] + 0x9fU) < 0x1a) {
                local_c0._M_dataplus._M_p[sVar14] = local_c0._M_dataplus._M_p[sVar14] + -0x20;
              }
              sVar14 = sVar14 + 1;
            } while (local_c0._M_string_length != sVar14);
          }
          local_98._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"cap_field_name","");
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_78,&local_98);
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Print(local_a0,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_78,
                             "public static final int $cap_field_name$_FIELD_NUMBER = $number$;\n");
          lVar15 = lVar15 + 1;
          uVar13 = extraout_RDX_07;
        } while (lVar15 < *(int *)(this_00 + 0x1c));
      }
      pPVar6 = local_a0;
      io::Printer::Print(local_a0,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_78,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(pPVar6,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_78,
                         "public int get$oneof_capitalized_name$Case() {\n  return this.$oneof_name$Case_;\n}\n"
                        );
      io::Printer::Print(pPVar6,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_78,
                         "public $message_name$ clear$oneof_capitalized_name$() {\n  this.$oneof_name$Case_ = 0;\n  this.$oneof_name$_ = null;\n  return this;\n}\n"
                        );
      lVar15 = local_38 + 1;
      pDVar9 = this->descriptor_;
      pOVar12 = extraout_RDX_08;
    } while (lVar15 < *(int *)(pDVar9 + 0x38));
  }
  iVar11 = *(int *)(pDVar9 + 0x78);
  pcVar18 = 
  "\nprivate static final $classname$[] EMPTY_ARRAY = {};\npublic static $classname$[] emptyArray() {\n  return EMPTY_ARRAY;\n}\n"
  ;
  if (iVar11 == 0) {
    pcVar18 = 
    "\nprivate static volatile $classname$[] _emptyArray;\npublic static $classname$[] emptyArray() {\n  // Lazily initializes the empty array\n  if (_emptyArray == null) {\n    synchronized (\n        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n      if (_emptyArray == null) {\n        _emptyArray = new $classname$[0];\n      }\n    }\n  }\n  return _emptyArray;\n}\n"
    ;
  }
  io::Printer::Print(local_a0,pcVar18,"classname",*(string **)pDVar9);
  iVar2 = (this->field_generators_).total_bits_;
  iVar16 = iVar2 + 0x3e;
  if (-1 < iVar2 + 0x1f) {
    iVar16 = iVar2 + 0x1f;
  }
  if (0 < iVar2) {
    io::Printer::Print(local_a0,"\n");
    uVar19 = 1;
    if (1 < iVar16 >> 5) {
      uVar19 = iVar16 >> 5;
    }
    uVar17 = 0;
    uVar13 = extraout_RDX_09;
    do {
      GetBitFieldName_abi_cxx11_(&local_c0,(javanano *)(ulong)uVar17,(int)uVar13);
      io::Printer::Print(local_a0,"private int $bit_field_name$;\n","bit_field_name",&local_c0);
      uVar13 = extraout_RDX_10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        uVar13 = extraout_RDX_11;
      }
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  pPVar6 = local_a0;
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x2c)) {
    lVar15 = 0;
    lVar20 = 0;
    do {
      io::Printer::Print(pPVar6,"\n");
      PrintFieldComment(pPVar6,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar15));
      pFVar10 = FieldGeneratorMap::get
                          (&this->field_generators_,
                           (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar15));
      (*pFVar10->_vptr_FieldGenerator[4])(pFVar10,pPVar6,(ulong)(iVar11 == 0));
      lVar20 = lVar20 + 1;
      pDVar9 = this->descriptor_;
      lVar15 = lVar15 + 0xa8;
    } while (lVar20 < *(int *)(pDVar9 + 0x2c));
  }
  if ((iVar11 == 0) && ((this->field_generators_).saved_defaults_needed_ == true)) {
    io::Printer::Print(pPVar6,
                       "\nprivate static volatile boolean _classInitialized;\n\npublic $classname$() {\n  // Lazily initializes the field defaults\n  if (!_classInitialized) {\n    synchronized (\n        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n      if (!_classInitialized) {\n"
                       ,"classname",*(string **)pDVar9);
    io::Printer::Indent(pPVar6);
    io::Printer::Indent(pPVar6);
    io::Printer::Indent(pPVar6);
    io::Printer::Indent(pPVar6);
    pDVar9 = this->descriptor_;
    if (0 < *(int *)(pDVar9 + 0x2c)) {
      lVar15 = 0;
      lVar20 = 0;
      do {
        pFVar10 = FieldGeneratorMap::get
                            (&this->field_generators_,
                             (FieldDescriptor *)(*(long *)(pDVar9 + 0x30) + lVar15));
        (*pFVar10->_vptr_FieldGenerator[3])(pFVar10,pPVar6);
        lVar20 = lVar20 + 1;
        pDVar9 = this->descriptor_;
        lVar15 = lVar15 + 0xa8;
      } while (lVar20 < *(int *)(pDVar9 + 0x2c));
    }
    io::Printer::Outdent(pPVar6);
    io::Printer::Outdent(pPVar6);
    io::Printer::Outdent(pPVar6);
    io::Printer::Outdent(pPVar6);
    io::Printer::Print(pPVar6,"        _classInitialized = true;\n      }\n    }\n  }\n");
    if (this->params_->generate_clear_ == false) goto LAB_0027ca10;
  }
  else {
    io::Printer::Print(pPVar6,"\npublic $classname$() {\n","classname",*(string **)pDVar9);
    if (this->params_->generate_clear_ != true) {
      io::Printer::Indent(pPVar6);
      GenerateFieldInitializers(this,pPVar6);
      io::Printer::Outdent(pPVar6);
      goto LAB_0027ca10;
    }
  }
  io::Printer::Print(pPVar6,"  clear();\n");
LAB_0027ca10:
  io::Printer::Print(pPVar6,"}\n");
  GenerateClear(this,pPVar6);
  if (this->params_->generate_clone_ == true) {
    GenerateClone(this,pPVar6);
  }
  if (this->params_->generate_equals_ == true) {
    GenerateEquals(this,pPVar6);
    GenerateHashCode(this,pPVar6);
  }
  GenerateMessageSerializationMethods(this,pPVar6);
  GenerateMergeFromMethods(this,pPVar6);
  io::Printer::Print(pPVar6,
                     "\npublic static $classname$ parseFrom(byte[] data)\n    throws com.google.protobuf.nano.InvalidProtocolBufferNanoException {\n  return com.google.protobuf.nano.MessageNano.mergeFrom(new $classname$(), data);\n}\n\npublic static $classname$ parseFrom(\n        com.google.protobuf.nano.CodedInputByteBufferNano input)\n    throws java.io.IOException {\n  return new $classname$().mergeFrom(input);\n}\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Outdent(pPVar6);
  io::Printer::Print(pPVar6,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_78);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  if (!params_.store_unknown_fields() &&
      (descriptor_->extension_count() != 0 || descriptor_->extension_range_count() != 0)) {
    GOOGLE_LOG(FATAL) << "Extensions are only supported in NANO_RUNTIME if the "
        "'store_unknown_fields' generator option is 'true'\n";
  }

  const string& file_name = descriptor_->file()->name();
  bool is_own_file =
    params_.java_multiple_files(file_name)
      && descriptor_->containing_type() == NULL;

  if (is_own_file) {
    // Note: constants (from enums and fields requiring stored defaults, emitted in the loop below)
    // may have the same names as constants in the nested classes. This causes Java warnings, but
    // is not fatal, so we suppress those warnings here in the top-most class declaration.
    printer->Print(
      "\n"
      "@SuppressWarnings(\"hiding\")\n"
      "public final class $classname$ extends\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "\n"
      "public static final class $classname$ extends\n",
      "classname", descriptor_->name());
  }
  if (params_.store_unknown_fields() && params_.parcelable_messages()) {
    printer->Print(
      "    com.google.protobuf.nano.android.ParcelableExtendableMessageNano<$classname$>",
      "classname", descriptor_->name());
  } else if (params_.store_unknown_fields()) {
    printer->Print(
      "    com.google.protobuf.nano.ExtendableMessageNano<$classname$>",
      "classname", descriptor_->name());
  } else if (params_.parcelable_messages()) {
    printer->Print(
      "    com.google.protobuf.nano.android.ParcelableMessageNano");
  } else {
    printer->Print(
      "    com.google.protobuf.nano.MessageNano");
  }
  if (params_.generate_clone()) {
    printer->Print(" implements java.lang.Cloneable {\n");
  } else {
    printer->Print(" {\n");
  }
  printer->Indent();

  if (params_.parcelable_messages()) {
    printer->Print(
      "\n"
      "// Used by Parcelable\n"
      "@SuppressWarnings({\"unused\"})\n"
      "public static final android.os.Parcelable.Creator<$classname$> CREATOR =\n"
      "    new com.google.protobuf.nano.android.ParcelableMessageNanoCreator<\n"
      "        $classname$>($classname$.class);\n",
      "classname", descriptor_->name());
  }

  // Nested types and extensions
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i), params_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), params_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    MessageGenerator(descriptor_->nested_type(i), params_).Generate(printer);
  }

  // oneof
  map<string, string> vars;
  vars["message_name"] = descriptor_->name();
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof_desc = descriptor_->oneof_decl(i);
    vars["oneof_name"] = UnderscoresToCamelCase(oneof_desc);
    vars["oneof_capitalized_name"] =
        UnderscoresToCapitalizedCamelCase(oneof_desc);
    vars["oneof_index"] = SimpleItoa(oneof_desc->index());
    // Oneof Constants
    for (int j = 0; j < oneof_desc->field_count(); j++) {
      const FieldDescriptor* field = oneof_desc->field(j);
      vars["number"] = SimpleItoa(field->number());
      vars["cap_field_name"] = ToUpper(field->name());
      printer->Print(vars,
        "public static final int $cap_field_name$_FIELD_NUMBER = $number$;\n");
    }
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    printer->Print(vars,
      "public int get$oneof_capitalized_name$Case() {\n"
      "  return this.$oneof_name$Case_;\n"
      "}\n");
    // Oneof clear
    printer->Print(vars,
      "public $message_name$ clear$oneof_capitalized_name$() {\n"
      "  this.$oneof_name$Case_ = 0;\n"
      "  this.$oneof_name$_ = null;\n"
      "  return this;\n"
      "}\n");
  }

  // Lazy initialization of otherwise static final fields can help prevent the
  // class initializer from being generated. We want to prevent it because it
  // stops ProGuard from inlining any methods in this class into call sites and
  // therefore reducing the method count. However, extensions are best kept as
  // public static final fields with initializers, so with their existence we
  // won't bother with lazy initialization.
  bool lazy_init = descriptor_->extension_count() == 0;

  // Empty array
  if (lazy_init) {
    printer->Print(
      "\n"
      "private static volatile $classname$[] _emptyArray;\n"
      "public static $classname$[] emptyArray() {\n"
      "  // Lazily initializes the empty array\n"
      "  if (_emptyArray == null) {\n"
      "    synchronized (\n"
      "        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n"
      "      if (_emptyArray == null) {\n"
      "        _emptyArray = new $classname$[0];\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return _emptyArray;\n"
      "}\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "\n"
      "private static final $classname$[] EMPTY_ARRAY = {};\n"
      "public static $classname$[] emptyArray() {\n"
      "  return EMPTY_ARRAY;\n"
      "}\n",
      "classname", descriptor_->name());
  }

  // Integers for bit fields
  int totalInts = (field_generators_.total_bits() + 31) / 32;
  if (totalInts > 0) {
    printer->Print("\n");
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // Fields and maybe their default values
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    PrintFieldComment(printer, descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(
        printer, lazy_init);
  }

  // Constructor, with lazy init code if needed
  if (lazy_init && field_generators_.saved_defaults_needed()) {
    printer->Print(
      "\n"
      "private static volatile boolean _classInitialized;\n"
      "\n"
      "public $classname$() {\n"
      "  // Lazily initializes the field defaults\n"
      "  if (!_classInitialized) {\n"
      "    synchronized (\n"
      "        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n"
      "      if (!_classInitialized) {\n",
      "classname", descriptor_->name());
    printer->Indent();
    printer->Indent();
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitSavedDefaultCode(printer);
    }
    printer->Outdent();
    printer->Outdent();
    printer->Outdent();
    printer->Outdent();
    printer->Print(
      "        _classInitialized = true;\n"
      "      }\n"
      "    }\n"
      "  }\n");
    if (params_.generate_clear()) {
      printer->Print("  clear();\n");
    }
    printer->Print("}\n");
  } else {
    printer->Print(
      "\n"
      "public $classname$() {\n",
      "classname", descriptor_->name());
    if (params_.generate_clear()) {
      printer->Print("  clear();\n");
    } else {
      printer->Indent();
      GenerateFieldInitializers(printer);
      printer->Outdent();
    }
    printer->Print("}\n");
  }

  // Other methods in this class

  GenerateClear(printer);

  if (params_.generate_clone()) {
    GenerateClone(printer);
  }

  if (params_.generate_equals()) {
    GenerateEquals(printer);
    GenerateHashCode(printer);
  }

  GenerateMessageSerializationMethods(printer);
  GenerateMergeFromMethods(printer);
  GenerateParseFromMethods(printer);

  printer->Outdent();
  printer->Print("}\n");
}